

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

Amount __thiscall
cfd::api::TransactionApi::EstimateFee
          (TransactionApi *this,string *tx_hex,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos,Amount *txout_fee,
          Amount *utxo_fee,double effective_fee_rate)

{
  AddressType addr_type_00;
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  size_type sVar4;
  char *fmt;
  double *args;
  long *args_1;
  int64_t *in_RCX;
  undefined1 uVar5;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RDX;
  undefined8 extraout_RDX;
  int64_t *in_R8;
  double in_XMM0_Qa;
  double dVar6;
  Amount AVar7;
  uint32_t total_vsize;
  uint32_t total_size;
  Amount utxo_fee_amount;
  Amount tx_fee_amount;
  FeeCalculator fee_calc;
  uint64_t fee_rate;
  uint32_t utxo_vsize;
  uint32_t tx_vsize;
  uint32_t tx_size;
  Script *scriptsig_template;
  Script redeem_script;
  AddressType addr_type;
  DescriptorScriptData data;
  string descriptor;
  AddressFactory_conflict address_factory;
  NetType_conflict net_type;
  UtxoData *utxo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  uint32_t not_witness_count;
  uint32_t nowit_size;
  uint32_t wit_size;
  uint32_t witness_size;
  uint32_t size;
  TransactionContext txc;
  Amount fee;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *in_stack_00001de8;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *in_stack_00001df0;
  string *in_stack_00001df8;
  string *in_stack_00001e00;
  AddressFactory *in_stack_00001e08;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00001e20;
  string *in_stack_fffffffffffff928;
  NetType type;
  DescriptorScriptData *in_stack_fffffffffffff930;
  undefined7 in_stack_fffffffffffff950;
  undefined8 in_stack_fffffffffffff958;
  uint32_t size_00;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  uint uVar9;
  Amount local_5f8;
  int64_t local_5e8;
  undefined1 local_5e0;
  Amount local_5d8;
  FeeCalculator local_5c4;
  ulong local_5c0;
  uint32_t local_5b4;
  uint32_t local_5b0;
  uint32_t local_5ac;
  Script local_5a8;
  Script *local_570;
  Script local_568;
  string local_530;
  AddressType local_510;
  allocator local_509;
  string local_508 [480];
  AddressType local_328;
  Script local_320 [6];
  string local_1b0 [88];
  string local_158;
  NetType local_134;
  reference local_130;
  UtxoData *local_128;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_120;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_118;
  uint local_10c;
  uint32_t local_108;
  uint32_t local_104;
  uint32_t local_100;
  uint32_t local_fc;
  double local_40;
  int64_t *local_38;
  int64_t *local_30;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_28;
  Amount local_10;
  
  local_40 = in_XMM0_Qa;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  local_fc = 0;
  local_100 = 0;
  local_104 = 0;
  local_108 = 0;
  local_10c = 0;
  local_118 = local_28;
  local_120._M_current =
       (UtxoData *)
       std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                 ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff928
                 );
  local_128 = (UtxoData *)
              std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                        ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                         in_stack_fffffffffffff928);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)in_stack_fffffffffffff930,
                       (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                        *)in_stack_fffffffffffff928);
    size_00 = (uint32_t)((ulong)in_stack_fffffffffffff958 >> 0x20);
    if (!bVar1) break;
    local_130 = __gnu_cxx::
                __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                ::operator*(&local_120);
    type = (NetType)((ulong)in_stack_fffffffffffff928 >> 0x20);
    local_134 = kMainnet;
    core::Address::GetAddress_abi_cxx11_(&local_158,&local_130->address);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_158);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_134 = core::Address::GetNetType(&local_130->address);
    }
    AddressFactory::AddressFactory((AddressFactory *)in_stack_fffffffffffff930,type);
    std::__cxx11::string::string(local_1b0,(string *)&local_130->descriptor);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"",&local_509);
    in_stack_fffffffffffff928 = (string *)0x0;
    AddressFactory::ParseOutputDescriptor
              (in_stack_00001e08,in_stack_00001e00,in_stack_00001df8,in_stack_00001df0,
               in_stack_00001de8,in_stack_00001e20);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
    core::Address::GetAddress_abi_cxx11_(&local_530,&local_130->address);
    bVar2 = std::__cxx11::string::empty();
    bVar1 = true;
    if (((bVar2 & 1) == 0) && (bVar1 = true, local_328 != kP2shP2wpkhAddress)) {
      bVar1 = local_328 == kP2shP2wshAddress;
    }
    std::__cxx11::string::~string((string *)&local_530);
    if (bVar1) {
      local_510 = local_328;
    }
    else {
      local_510 = core::Address::GetAddressType(&local_130->address);
    }
    core::Script::Script(&local_568);
    bVar1 = core::Script::IsEmpty(&local_130->redeem_script);
    if ((!bVar1) || (bVar1 = core::Script::IsEmpty(local_320), bVar1)) {
      core::Script::operator=(&local_568,&local_130->redeem_script);
    }
    else {
      core::Script::operator=(&local_568,local_320);
    }
    local_570 = (Script *)0x0;
    bVar1 = core::Script::IsEmpty(&local_568);
    if (((!bVar1) || (local_510 == kTaprootAddress)) &&
       (bVar1 = core::Script::IsEmpty(&local_130->scriptsig_template), !bVar1)) {
      local_570 = &local_130->scriptsig_template;
    }
    addr_type_00 = local_510;
    core::Script::Script(&local_5a8,&local_568);
    core::TxIn::EstimateTxInSize(addr_type_00,&local_5a8,&local_104,&local_108,local_570);
    core::Script::~Script((Script *)in_stack_fffffffffffff930);
    local_fc = local_108 + local_fc;
    local_100 = local_104 + local_100;
    if (local_104 == 0) {
      local_10c = local_10c + 1;
    }
    core::Script::~Script((Script *)in_stack_fffffffffffff930);
    DescriptorScriptData::~DescriptorScriptData(in_stack_fffffffffffff930);
    std::__cxx11::string::~string(local_1b0);
    AddressFactory::~AddressFactory((AddressFactory *)0x540437);
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_120);
  }
  local_5ac = TransactionContext::GetSizeIgnoreTxIn
                        ((TransactionContext *)
                         CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                         SUB81((ulong)in_stack_fffffffffffff978 >> 0x38,0));
  local_5b0 = core::AbstractTransaction::GetVsizeFromSize(local_5ac,0);
  if (((local_100 != 0) && (local_10c != 0)) &&
     (uVar9 = local_10c,
     sVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(local_28),
     uVar9 < (uint)sVar4)) {
    local_100 = local_10c + local_100;
  }
  local_5b4 = core::AbstractTransaction::GetVsizeFromSize(local_fc,local_100);
  dVar6 = floor(local_40 * 1000.0);
  local_5c0 = (long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f;
  FeeCalculator::FeeCalculator(&local_5c4,local_5c0);
  AVar7 = FeeCalculator::GetFee
                    ((FeeCalculator *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                     size_00);
  local_5e8 = AVar7.amount_;
  local_5e0 = AVar7.ignore_check_;
  local_5d8.amount_ = local_5e8;
  local_5d8.ignore_check_ = (bool)local_5e0;
  AVar7 = FeeCalculator::GetFee
                    ((FeeCalculator *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                     size_00);
  local_5f8.amount_ = AVar7.amount_;
  local_5f8.ignore_check_ = AVar7.ignore_check_;
  uVar8 = CONCAT13(local_5f8.ignore_check_,(int3)in_stack_fffffffffffff964);
  uVar3 = core::AbstractTransaction::GetVsizeFromSize(local_5ac + local_fc,local_100);
  AVar7 = FeeCalculator::GetFee((FeeCalculator *)CONCAT44(uVar8,uVar3),size_00);
  local_10.amount_ = AVar7.amount_;
  uVar5 = AVar7.ignore_check_;
  if (local_30 != (int64_t *)0x0) {
    *local_30 = local_5d8.amount_;
    *(bool *)(local_30 + 1) = local_5d8.ignore_check_;
  }
  if (local_38 != (int64_t *)0x0) {
    *local_38 = local_5f8.amount_;
    *(bool *)(local_38 + 1) = local_5f8.ignore_check_;
  }
  local_10.ignore_check_ = (bool)uVar5;
  strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
          ,0x2f);
  fmt = (char *)core::Amount::GetSatoshiValue(&local_10);
  args = (double *)core::Amount::GetSatoshiValue(&local_5d8);
  args_1 = (long *)core::Amount::GetSatoshiValue(&local_5f8);
  core::logger::info<double&,long,long,long>
            ((CfdSourceLocation *)CONCAT17(uVar5,in_stack_fffffffffffff950),fmt,args,args_1,
             (long *)in_stack_fffffffffffff930,(long *)in_stack_fffffffffffff928);
  TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffff930);
  AVar7._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar7.ignore_check_ = local_10.ignore_check_;
  AVar7.amount_ = local_10.amount_;
  return AVar7;
}

Assistant:

Amount TransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<UtxoData>& utxos,
    Amount* txout_fee, Amount* utxo_fee, double effective_fee_rate) const {
  TransactionContext txc(tx_hex);

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t nowit_size = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kMainnet;
    if (!utxo.address.GetAddress().empty()) {
      net_type = utxo.address.GetNetType();
    }
    AddressFactory address_factory(net_type);
    // check descriptor
    std::string descriptor = utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = address_factory.ParseOutputDescriptor(descriptor);

    AddressType addr_type;
    if (utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if (((!redeem_script.IsEmpty()) ||
         (addr_type == AddressType::kTaprootAddress)) &&
        (!utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.scriptsig_template;
    }

    TxIn::EstimateTxInSize(
        addr_type, redeem_script, &wit_size, &nowit_size, scriptsig_template);
    size += nowit_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }

  uint32_t tx_size = txc.GetSizeIgnoreTxIn((witness_size != 0));
  uint32_t tx_vsize = AbstractTransaction::GetVsizeFromSize(tx_size, 0);

  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint64_t fee_rate = static_cast<uint64_t>(floor(effective_fee_rate * 1000));
  FeeCalculator fee_calc(fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_size = tx_size + size;
  uint32_t total_vsize =
      AbstractTransaction::GetVsizeFromSize(total_size, witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}